

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O1

uint64_t pac_mult(uint64_t i)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar2 = 0;
  uVar4 = 0;
  do {
    bVar1 = (byte)uVar4;
    uVar9 = (uint)(i >> (bVar1 & 0x3f)) & 0xf;
    uVar7 = (uint)(i >> (bVar1 + 0x10 & 0x3f)) & 0xf;
    uVar5 = (uint)(i >> (bVar1 + 0x20 & 0x3f)) & 0xf;
    uVar10 = (uint)(i >> (bVar1 + 0x30 & 0x3f)) & 0xf;
    uVar5 = uVar5 << 4 | uVar5;
    uVar6 = uVar5 >> 3;
    uVar7 = uVar7 << 4 | uVar7;
    uVar9 = uVar9 << 4 | uVar9;
    uVar8 = uVar9 >> 3;
    uVar10 = uVar10 << 4 | uVar10;
    uVar11 = uVar10 >> 3;
    uVar3 = uVar7 >> 3;
    uVar2 = uVar2 | (ulong)((uVar7 >> 2 ^ uVar8 ^ uVar6) & 0xf) << (bVar1 + 0x30 & 0x3f) |
            ((ulong)((uVar9 >> 2 ^ uVar3 ^ uVar11) & 0xf) << (bVar1 + 0x20 & 0x3f)) +
            ((ulong)((uVar10 >> 2 ^ uVar8 ^ uVar6) & 0xf) << (bVar1 + 0x10 & 0x3f)) +
            ((ulong)((uVar5 >> 2 ^ uVar11 ^ uVar3) & 0xf) << (bVar1 & 0x3f));
    bVar12 = uVar4 < 0xc;
    uVar4 = uVar4 + 4;
  } while (bVar12);
  return uVar2;
}

Assistant:

static uint64_t pac_mult(uint64_t i)
{
    uint64_t o = 0;
    int b;

    for (b = 0; b < 4 * 4; b += 4) {
        int i0, i4, i8, ic, t0, t1, t2, t3;

        i0 = extract64(i, b, 4);
        i4 = extract64(i, b + 4 * 4, 4);
        i8 = extract64(i, b + 8 * 4, 4);
        ic = extract64(i, b + 12 * 4, 4);

        t0 = rot_cell(i8, 1) ^ rot_cell(i4, 2) ^ rot_cell(i0, 1);
        t1 = rot_cell(ic, 1) ^ rot_cell(i4, 1) ^ rot_cell(i0, 2);
        t2 = rot_cell(ic, 2) ^ rot_cell(i8, 1) ^ rot_cell(i0, 1);
        t3 = rot_cell(ic, 1) ^ rot_cell(i8, 2) ^ rot_cell(i4, 1);

        o |= (uint64_t)t3 << b;
        o |= (uint64_t)t2 << (b + 4 * 4);
        o |= (uint64_t)t1 << (b + 8 * 4);
        o |= (uint64_t)t0 << (b + 12 * 4);
    }
    return o;
}